

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.h
# Opt level: O2

Result __thiscall
GetOpt::_OptionTBase<int>::operator()
          (_OptionTBase<int> *this,ShortOptions *short_ops,LongOptions *long_ops,Token *param_3,
          fmtflags flags)

{
  Result RVar1;
  iterator iVar2;
  iterator iVar3;
  _Base_ptr *pp_Var4;
  
  if (this->short_opt != '\0') {
    iVar2 = std::
            _Rb_tree<char,_std::pair<const_char,_GetOpt::OptionData>,_std::_Select1st<std::pair<const_char,_GetOpt::OptionData>_>,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
            ::find(&short_ops->_M_t,&this->short_opt);
    if ((_Rb_tree_header *)iVar2._M_node != &(short_ops->_M_t)._M_impl.super__Rb_tree_header) {
      *(undefined4 *)&iVar2._M_node[1]._M_parent = 1;
      pp_Var4 = &iVar2._M_node[1]._M_left;
      goto LAB_00103eed;
    }
  }
  if ((this->long_opt)._M_string_length != 0) {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>_>
            ::find(&long_ops->_M_t,&this->long_opt);
    if ((_Rb_tree_header *)iVar3._M_node != &(long_ops->_M_t)._M_impl.super__Rb_tree_header) {
      iVar3._M_node[2]._M_color = _S_black;
      pp_Var4 = &iVar3._M_node[2]._M_parent;
LAB_00103eed:
      RVar1 = (*(this->super__Option)._vptr__Option[3])(this,*pp_Var4,(ulong)(uint)flags,short_ops);
      return RVar1;
    }
  }
  return OptionNotFound;
}

Assistant:

virtual Result operator()(ShortOptions& short_ops, LongOptions& long_ops, Token* /*first*/, std::ios::fmtflags flags) const
    {
        Result ret = OptionNotFound;
        ShortOptions::iterator it;
        if (short_opt == _Option::NO_SHORT_OPT)
            it = short_ops.end();
        else
            it = short_ops.find(short_opt);

        if (it != short_ops.end())
        {
            it->second.flags = OptionData::CmdLine_Extracted;
            ret = _assign(it->second.token, flags, short_ops);
        }
        else if (!long_opt.empty())
        {
            LongOptions::iterator it = long_ops.find(long_opt);
            if (it != long_ops.end())
            {
                it->second.flags = OptionData::CmdLine_Extracted;
                ret = _assign(it->second.token, flags, short_ops);
            }
        }

        return ret;
    }